

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_18::Inlining::run(Inlining *this,Module *module_)

{
  NameInfoMap *this_00;
  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>_>
  *this_01;
  pointer *ppIVar1;
  undefined8 *puVar2;
  uint uVar3;
  InliningMode IVar4;
  mapped_type mVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  Global *pGVar10;
  pointer puVar11;
  pointer ppEVar12;
  pointer puVar13;
  DataSegment *pDVar14;
  pointer puVar15;
  Export *pEVar16;
  PassRunner *pPVar17;
  FunctionSplitter *pFVar18;
  BranchSeeker *this_02;
  uintptr_t uVar19;
  char *__c;
  _Hash_node_base _Var20;
  _Hash_node_base *p_Var21;
  __node_ptr p_Var22;
  anon_struct_8_0_00000001_for___align aVar23;
  __node_base_ptr p_Var24;
  __node_base _Var25;
  pointer this_03;
  pointer pIVar26;
  IString name_00;
  string_view sVar27;
  char *pcVar28;
  size_type *psVar29;
  _func_int **pp_Var30;
  __buckets_ptr pp_Var31;
  undefined1 auVar32 [8];
  uint uVar33;
  bool bVar34;
  Index IVar35;
  Index IVar36;
  mapped_type *pmVar37;
  FunctionSplitter *pFVar38;
  Function *pFVar39;
  Function *tree;
  If *pIVar40;
  Expression *pEVar41;
  __node_base_ptr *pp_Var42;
  __node_base_ptr p_Var43;
  size_type sVar44;
  mapped_type *pmVar45;
  size_type sVar46;
  __node_base _Var47;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var48;
  Function *pFVar49;
  Unary *pUVar50;
  Call *pCVar51;
  Block *pBVar52;
  _Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
  *this_04;
  pointer pIVar53;
  pointer pIVar54;
  long lVar55;
  mapped_type *pmVar56;
  Return *pRVar57;
  size_t *psVar58;
  int iVar59;
  _Hash_node_base _Var60;
  FunctionSplitter *builder_00;
  pointer pIVar61;
  ulong uVar62;
  __buckets_ptr __n;
  ulong uVar63;
  size_type __n_00;
  char *__s_00;
  Type results;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar64;
  pointer puVar65;
  __node_ptr p_Var66;
  size_type *psVar67;
  ElementSegment *pEVar68;
  variant<wasm::Name,_wasm::HeapType> *__k;
  Module *pMVar69;
  __node_base _Var70;
  uint uVar71;
  pointer ppEVar72;
  pointer pIVar73;
  uint i;
  pointer pIVar74;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar75;
  pointer puVar76;
  pointer puVar77;
  __node_base *p_Var78;
  Signature SVar79;
  undefined1 auVar80 [16];
  Name target;
  Iterator it;
  __node_ptr p_Stack_3e0;
  undefined1 local_3d8 [8];
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  iterationCounts;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  inlinedUses;
  FunctionInfoScanner scanner;
  undefined1 local_228 [8];
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  inlinedInto;
  undefined1 auStack_1d8 [8];
  Name name;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 auStack_1a8 [8];
  Name inlinedName;
  undefined1 local_190 [24];
  undefined1 auStack_178 [8];
  ChosenActions chosenActions;
  Function *inlinedFunction;
  undefined1 local_130 [8];
  InliningState state;
  undefined1 auStack_b8 [8];
  __buckets_alloc_type __alloc_1;
  Function *local_98;
  Function *func_2;
  undefined1 local_88 [8];
  Builder builder;
  anon_struct_8_0_00000001_for___align local_78;
  
  this->module = module_;
  puVar6 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar7 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_3d8 = (undefined1  [8])&iterationCounts._M_h._M_rehash_policy._M_next_resize;
  iterationCounts._M_h._M_buckets = (__buckets_ptr)0x1;
  iterationCounts._M_h._M_bucket_count = 0;
  iterationCounts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  iterationCounts._M_h._M_element_count._0_4_ = 0x3f800000;
  iterationCounts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  iterationCounts._M_h._M_rehash_policy._4_4_ = 0;
  iterationCounts._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = &this->infos;
  uVar62 = 0;
LAB_00a3bda5:
  if (uVar62 <= (ulong)((long)puVar6 - (long)puVar7 >> 3)) {
    local_228 = (undefined1  [8])&inlinedInto._M_h._M_rehash_policy._M_next_resize;
    inlinedInto._M_h._M_buckets = (__buckets_ptr)0x1;
    inlinedInto._M_h._M_bucket_count = 0;
    inlinedInto._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedInto._M_h._M_element_count._0_4_ = 0x3f800000;
    inlinedInto._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inlinedInto._M_h._M_rehash_policy._4_4_ = 0;
    inlinedInto._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&this_00->_M_h);
    puVar8 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar65 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar65 != puVar8;
        puVar65 = puVar65 + 1) {
      std::
      unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
      ::operator[](this_00,(key_type *)
                           (puVar65->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.runner =
         (PassRunner *)
         &scanner.
          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
          .super_Pass.name._M_string_length;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.name._M_string_length._0_4_ =
         (uint)scanner.
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
               .super_Pass.name._M_string_length & 0xffffff00;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .replacep = (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currFunction = (Function *)0x0;
    inlinedUses._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_01121800;
    pMVar69 = this->module;
    pp_Var42 = &inlinedUses._M_h._M_single_bucket;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currModule = (Module *)this_00;
    state.actionsForFunction._M_h._M_single_bucket._4_4_ = (int)uVar62 + 1;
    Pass::setPassRunner((Pass *)pp_Var42,(this->super_Pass).runner);
    (*(code *)inlinedUses._M_h._M_single_bucket[2]._M_nxt)(pp_Var42,pMVar69);
    pMVar69 = this->module;
    puVar9 = (pMVar69->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currFunction = (Function *)pMVar69;
    for (puVar75 = (pMVar69->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar75 != puVar9;
        puVar75 = puVar75 + 1) {
      pGVar10 = (puVar75->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar10->super_Importable).module + 8) == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)((long)&scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                          .super_Pass.passArg.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  + 0x20),&pGVar10->init);
      }
    }
    puVar11 = (pMVar69->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar76 = (pMVar69->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar76 != puVar11;
        puVar76 = puVar76 + 1) {
      pEVar68 = (puVar76->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar68->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)((long)&scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                          .super_Pass.passArg.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  + 0x20),&pEVar68->offset);
        pEVar68 = (puVar76->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      ppEVar12 = *(pointer *)
                  ((long)&(pEVar68->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl + 8);
      for (ppEVar72 = (pEVar68->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar72 != ppEVar12;
          ppEVar72 = ppEVar72 + 1) {
        local_130 = (undefined1  [8])*ppEVar72;
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)((long)&scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                          .super_Pass.passArg.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  + 0x20),(Expression **)local_130);
      }
    }
    puVar13 = (pMVar69->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar77 = (pMVar69->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar77 != puVar13;
        puVar77 = puVar77 + 1) {
      pDVar14 = (puVar77->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar14->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)((long)&scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                          .super_Pass.passArg.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  + 0x20),&pDVar14->offset);
      }
    }
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currFunction = (Function *)0x0;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                   *)&inlinedUses._M_h._M_single_bucket);
    puVar15 = (this->module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar64 = (this->module->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar64 != puVar15;
        puVar64 = puVar64 + 1) {
      pEVar16 = (puVar64->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar16->kind == Function) {
        if (*(__index_type *)
             ((long)&(pEVar16->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
            '\0') {
          __k = &pEVar16->value;
        }
        else {
          __k = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        pmVar37 = std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,(key_type *)__k);
        pmVar37->usedGlobally = true;
      }
    }
    pMVar69 = this->module;
    if ((pMVar69->start).super_IString.str._M_str != (char *)0x0) {
      pMVar69 = (Module *)&pMVar69->start;
      pmVar37 = std::
                unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                ::operator[](this_00,(key_type *)pMVar69);
      pmVar37->usedGlobally = true;
    }
    pPVar17 = (this->super_Pass).runner;
    if (((2 < (pPVar17->options).optimizeLevel) && ((pPVar17->options).shrinkLevel == 0)) &&
       ((pPVar17->options).inlining.partialInliningIfs != 0)) {
      pFVar38 = (FunctionSplitter *)operator_new(0x48);
      pFVar38->module = this->module;
      pFVar38->options = &pPVar17->options;
      (pFVar38->splits)._M_h._M_buckets = (__node_base_ptr *)((long)&(pFVar38->splits)._M_h + 0x30);
      *(size_type *)((long)&(pFVar38->splits)._M_h + 8) = 1;
      ((__node_base *)((long)&(pFVar38->splits)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
      *(size_type *)((long)&(pFVar38->splits)._M_h + 0x18) = 0;
      ((_Prime_rehash_policy *)((long)&(pFVar38->splits)._M_h + 0x20))->_M_max_load_factor = 1.0;
      inlinedUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
      *(size_t *)((long)&(pFVar38->splits)._M_h + 0x28) = 0;
      *(__node_base_ptr *)((long)&(pFVar38->splits)._M_h + 0x30) = (__node_base_ptr)0x0;
      pFVar18 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      (this->functionSplitter)._M_t.
      super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>._M_head_impl =
           pFVar38;
      if (pFVar18 != (FunctionSplitter *)0x0) {
        std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>::operator()
                  ((default_delete<wasm::(anonymous_namespace)::FunctionSplitter> *)pFVar18,
                   (FunctionSplitter *)pMVar69);
      }
      std::
      unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                     *)&inlinedUses._M_h._M_single_bucket);
    }
    local_130 = (undefined1  [8])&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize;
    state.inlinableFunctions._M_h._M_buckets = (__buckets_ptr)0x1;
    state.inlinableFunctions._M_h._M_bucket_count = 0;
    state.inlinableFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.inlinableFunctions._M_h._M_element_count._0_4_ = 0x3f800000;
    state.inlinableFunctions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.inlinableFunctions._M_h._M_rehash_policy._4_4_ = 0;
    state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize = 0;
    funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize;
    state.actionsForFunction._M_h._M_buckets = (__buckets_ptr)0x1;
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.actionsForFunction._M_h._M_element_count._0_4_ = 0x3f800000;
    state.actionsForFunction._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.actionsForFunction._M_h._M_rehash_policy._4_4_ = 0;
    state.actionsForFunction._M_h._M_rehash_policy._M_next_resize = 0;
    puVar8 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state.inlinableFunctions._M_h._M_single_bucket =
         (__node_base_ptr)
         funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
         super__Vector_impl_data._M_start;
    for (puVar65 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar65 != puVar8;
        puVar65 = puVar65 + 1) {
      pFVar49 = (puVar65->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar49->super_Importable).module + 8) == (char *)0x0) {
        auStack_178 = *(undefined1 (*) [8])&(pFVar49->super_Importable).super_Named;
        chosenActions._M_h._M_buckets =
             *(__buckets_ptr *)((long)&(pFVar49->super_Importable).super_Named + 8);
        name_00.str = *(string_view *)&(pFVar49->super_Importable).super_Named;
        pFVar39 = Module::getFunction(this->module,
                                      (Name)*(string_view *)&(pFVar49->super_Importable).super_Named
                                     );
        pmVar37 = std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,(key_type *)auStack_178);
        funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(ulong)pmVar37->inliningMode;
        if (pmVar37->inliningMode == Unknown) {
          if (pFVar39->noFullInline == false) {
            bVar34 = FunctionInfo::worthFullInlining(pmVar37,&((this->super_Pass).runner)->options);
            p_Stack_3e0 = (__node_ptr)0x2;
            if (!bVar34) goto LAB_00a3c1ad;
          }
          else {
LAB_00a3c1ad:
            p_Stack_3e0 = (__node_ptr)0x1;
            if ((pFVar39->noPartialInline == false) &&
               (pFVar18 = (this->functionSplitter)._M_t.
                          super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          .
                          super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                          ._M_head_impl, pFVar18 != (FunctionSplitter *)0x0)) {
              pFVar39 = Module::getFunction(this->module,(Name)name_00.str);
              uVar3 = (pFVar18->options->inlining).partialInliningIfs;
              if (uVar3 == 0) {
                __assert_fail("MaxIfs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                              ,0x335,
                              "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                             );
              }
              this_02 = (BranchSeeker *)pFVar39->body;
              if (*(char *)&(this_02->
                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            ).
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .replacep == '\x01') {
                target.super_IString.str._M_str = (char *)p_Stack_3e0;
                target.super_IString.str._M_len =
                     (size_t)(this_02->
                             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             ).
                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             .stack.fixed._M_elems[0].currp;
                bVar34 = BranchUtils::BranchSeeker::has
                                   (this_02,(Expression *)
                                            (this_02->
                                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                            ).
                                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                            .stack.fixed._M_elems[0].func,target);
                p_Stack_3e0 = (__node_ptr)0x1;
                if (bVar34) goto LAB_00a3c454;
              }
              pEVar41 = (Expression *)0x0;
              tree = (Function *)FunctionSplitter::getIf((Expression *)this_02,0);
              p_Stack_3e0 = (__node_ptr)0x1;
              if (tree != (Function *)0x0) {
                bVar34 = FunctionSplitter::isSimple
                                   (*(FunctionSplitter **)
                                     &(tree->super_Importable).super_Named.hasExplicitName,pEVar41);
                p_Stack_3e0 = (__node_ptr)0x1;
                if (bVar34) {
                  if ((((Expression *)(tree->super_Importable).module.super_IString.str._M_str ==
                        (Expression *)0x0) &&
                      (SVar79 = HeapType::getSignature(&pFVar39->type), SVar79.results.id.id == 0))
                     && (((Expression *)(tree->super_Importable).module.super_IString.str._M_len)->
                         _id == ReturnId)) {
                    if (*(char *)&(this_02->
                                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                  ).
                                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                  .replacep != '\x01') {
                      __assert_fail("body->is<Block>()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                    ,0x358,
                                    "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                                   );
                    }
                    IVar36 = pmVar37->size;
                    IVar35 = Measurer::measure((Expression *)tree);
                    if (pFVar39->noFullInline == false) {
                      bVar34 = FunctionSplitter::outlinedFunctionWorthInlining
                                         (pFVar18,pmVar37,IVar36 - IVar35);
                      p_Stack_3e0 = (__node_ptr)0x2;
                      if (bVar34) goto LAB_00a3c454;
                    }
                    p_Stack_3e0 = (__node_ptr)0x3;
                  }
                  else {
                    uVar71 = 0;
                    uVar33 = 0;
                    func_2 = tree;
                    do {
                      i = uVar33;
                      pIVar40 = FunctionSplitter::getIf((Expression *)this_02,i);
                      uVar71 = uVar71 - 1;
                      if (uVar3 < i) break;
                      uVar33 = i + 1;
                    } while (pIVar40 != (If *)0x0);
                    p_Stack_3e0 = (__node_ptr)0x1;
                    if (-uVar71 - 2 < uVar3) {
                      pEVar41 = (Expression *)(ulong)~uVar71;
                      pFVar38 = (FunctionSplitter *)
                                FunctionSplitter::getItem((Expression *)this_02,~uVar71);
                      if (pFVar38 == (FunctionSplitter *)0x0) {
LAB_00a3c37a:
                        pEVar41 = (Expression *)0x0;
                        while (IVar36 = (Index)pEVar41, i != IVar36) {
                          pIVar40 = FunctionSplitter::getIf((Expression *)this_02,IVar36);
                          bVar34 = FunctionSplitter::isSimple
                                             ((FunctionSplitter *)pIVar40->condition,pEVar41);
                          if ((!bVar34) || (pIVar40->ifFalse != (Expression *)0x0)) {
LAB_00a3c404:
                            p_Stack_3e0 = (__node_ptr)0x1;
                            goto LAB_00a3c454;
                          }
                          uVar19 = (pIVar40->ifTrue->type).id;
                          if (uVar19 != 1) {
                            if (uVar19 != 0) {
                              __assert_fail("iff->ifTrue->type == Type::unreachable",
                                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                            ,0x3ad,
                                            "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                                           );
                            }
                            pp_Var42 = &inlinedUses._M_h._M_single_bucket;
                            FindAll<wasm::Return>::FindAll
                                      ((FindAll<wasm::Return> *)pp_Var42,pIVar40->ifTrue);
                            pp_Var30 = scanner.
                                       super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                                       .super_Pass._vptr_Pass;
                            builder.wasm = (Module *)inlinedUses._M_h._M_single_bucket;
                            std::_Vector_base<wasm::Return_*,_std::allocator<wasm::Return_*>_>::
                            ~_Vector_base((_Vector_base<wasm::Return_*,_std::allocator<wasm::Return_*>_>
                                           *)pp_Var42);
                            if (builder.wasm != (Module *)pp_Var30) goto LAB_00a3c404;
                          }
                          pEVar41 = (Expression *)(ulong)(IVar36 + 1);
                        }
                        p_Stack_3e0 = (__node_ptr)0x4;
                        if (uVar71 == 0xfffffffe) {
                          IVar36 = Measurer::measure((Expression *)
                                                     (func_2->super_Importable).module.super_IString
                                                     .str._M_len);
                          if (pFVar39->noFullInline == false) {
                            bVar34 = FunctionSplitter::outlinedFunctionWorthInlining
                                               (pFVar18,pmVar37,IVar36);
                            p_Stack_3e0 = (__node_ptr)0x2;
                            if (bVar34) goto LAB_00a3c454;
                          }
                          p_Stack_3e0 = (__node_ptr)0x4;
                        }
                      }
                      else {
                        bVar34 = FunctionSplitter::isSimple(pFVar38,pEVar41);
                        p_Stack_3e0 = (__node_ptr)0x1;
                        if (bVar34) {
                          pEVar41 = FunctionSplitter::getItem((Expression *)this_02,i + 1);
                          p_Stack_3e0 = (__node_ptr)0x1;
                          if (pEVar41 == (Expression *)0x0) goto LAB_00a3c37a;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_00a3c454:
          pmVar37->inliningMode = (InliningMode)p_Stack_3e0;
          funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Stack_3e0;
        }
        iVar59 = (int)funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (iVar59 != 1) {
          __c = *(char **)((long)&(pFVar49->super_Importable).super_Named + 8);
          uVar62 = (ulong)__c % (ulong)state.inlinableFunctions._M_h._M_buckets;
          funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)std::
                        _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::_M_find_node((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                        *)local_130,uVar62,(key_type *)pFVar49,(__hash_code)__c);
          if ((__node_ptr)
              funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start == (__node_ptr)0x0) {
            inlinedUses._M_h._M_single_bucket = (__node_base_ptr)local_130;
            funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)operator_new(0x28);
            (((__node_ptr)
             funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start)->super__Hash_node_base)._M_nxt =
                 (_Hash_node_base *)0x0;
            pcVar28 = *(char **)((long)&(pFVar49->super_Importable).super_Named + 8);
            (((__node_ptr)
             funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start)->
            super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
            ._M_storage._M_storage.__align =
                 *(anon_struct_8_0_00000001_for___align *)&(pFVar49->super_Importable).super_Named;
            *(char **)((long)&(((__node_ptr)
                               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                              ._M_storage._M_storage + 8) = pcVar28;
            *(undefined4 *)
             ((long)&(((__node_ptr)
                      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start)->
                     super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                     ._M_storage._M_storage + 0x10) = 0;
            scanner.
            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
            .super_Pass._vptr_Pass =
                 (_func_int **)
                 funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start;
            auVar80 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)&state.inlinableFunctions._M_h._M_element_count,
                                 (ulong)state.inlinableFunctions._M_h._M_buckets,
                                 (ulong)state.inlinableFunctions._M_h._M_before_begin._M_nxt);
            __n = auVar80._8_8_;
            if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (__n == (__buckets_ptr)0x1) {
                state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize = 0;
                pEVar41 = (Expression *)
                          &state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize;
              }
              else {
                pEVar41 = (Expression *)
                          std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                          allocate((allocator_type *)auStack_178,(size_type)__n);
                memset(pEVar41,0,(long)__n * 8);
              }
              _Var20._M_nxt = (_Hash_node_base *)state.inlinableFunctions._M_h._M_bucket_count;
              state.inlinableFunctions._M_h._M_bucket_count = 0;
              uVar62 = 0;
LAB_00a3c53f:
              uVar63 = uVar62;
              _Var60._M_nxt = _Var20._M_nxt;
              if (_Var60._M_nxt != (_Hash_node_base *)0x0) {
                _Var20._M_nxt = (_Var60._M_nxt)->_M_nxt;
                uVar62 = (ulong)_Var60._M_nxt[4]._M_nxt % (ulong)__n;
                if (*(__node_base_ptr *)((long)&pEVar41->_id + uVar62 * 8) == (_Hash_node_base *)0x0
                   ) goto LAB_00a3c56e;
                (_Var60._M_nxt)->_M_nxt =
                     (*(__node_base_ptr *)((long)&pEVar41->_id + uVar62 * 8))->_M_nxt;
                pp_Var42 = *(__node_base_ptr **)((long)&pEVar41->_id + uVar62 * 8);
                uVar62 = uVar63;
                goto LAB_00a3c594;
              }
              std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_deallocate_buckets
                        ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_130);
              state.inlinableFunctions._M_h._M_buckets = __n;
              local_130 = (undefined1  [8])pEVar41;
              uVar62 = (ulong)__c % (ulong)__n;
            }
            (((__node_ptr)
             funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start)->
            super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
            ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)__c;
            p_Var21 = *(__node_base_ptr *)((long)local_130 + uVar62 * 8);
            if (p_Var21 == (_Hash_node_base *)0x0) {
              (((__node_ptr)
               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start)->super__Hash_node_base)._M_nxt =
                   (_Hash_node_base *)state.inlinableFunctions._M_h._M_bucket_count;
              if (state.inlinableFunctions._M_h._M_bucket_count != 0) {
                *(pointer *)
                 ((long)local_130 +
                 (*(ulong *)(state.inlinableFunctions._M_h._M_bucket_count + 0x20) %
                 (ulong)state.inlinableFunctions._M_h._M_buckets) * 8) =
                     funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              *(size_type **)((long)local_130 + uVar62 * 8) =
                   &state.inlinableFunctions._M_h._M_bucket_count;
              state.inlinableFunctions._M_h._M_bucket_count =
                   (size_type)
                   funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            else {
              (((__node_ptr)
               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start)->super__Hash_node_base)._M_nxt = p_Var21->_M_nxt;
              (*(__node_base_ptr *)((long)local_130 + uVar62 * 8))->_M_nxt =
                   (_Hash_node_base *)
                   funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            state.inlinableFunctions._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)
                 ((long)&(state.inlinableFunctions._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
            scanner.
            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
            .super_Pass._vptr_Pass = (_func_int **)0x0;
            std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Scoped_node::~_Scoped_node((_Scoped_node *)&inlinedUses._M_h._M_single_bucket);
          }
          *(int *)((long)&(((__node_ptr)
                           funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                          super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                          ._M_storage._M_storage + 0x10) = iVar59;
        }
      }
    }
    if (state.inlinableFunctions._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      name.super_IString.str._M_str = (char *)0x0;
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      puVar8 = (this->module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar65 = (this->module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar65 != puVar8;
          puVar65 = puVar65 + 1) {
        std::
        unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
        ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                      *)&state.inlinableFunctions._M_h._M_single_bucket,
                     (key_type *)
                     (puVar65->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&name.super_IString.str._M_str
                   ,(value_type *)
                    (puVar65->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.runner =
           (PassRunner *)
           &scanner.
            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
            .super_Pass.name._M_string_length;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_string_length._0_4_ =
           (uint)scanner.
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                 .super_Pass.name._M_string_length & 0xffffff00;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.passArg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.passArg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.passArg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._33_7_ = 0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .replacep = (Expression **)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .currFunction = (Function *)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .currModule = (Module *)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.fixed._M_elems[9].currp = (Expression **)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      inlinedUses._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_01121860;
      pMVar69 = this->module;
      pp_Var42 = &inlinedUses._M_h._M_single_bucket;
      scanner.infos = (NameInfoMap *)local_130;
      Pass::setPassRunner((Pass *)pp_Var42,(this->super_Pass).runner);
      (*(code *)inlinedUses._M_h._M_single_bucket[2]._M_nxt)(pp_Var42,pMVar69);
      WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
      ::~WalkerPass((WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                     *)pp_Var42);
      auStack_178 = (undefined1  [8])&chosenActions._M_h._M_rehash_policy._M_next_resize;
      chosenActions._M_h._M_buckets = (__buckets_ptr)0x1;
      chosenActions._M_h._M_bucket_count = 0;
      chosenActions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      chosenActions._M_h._M_element_count._0_4_ = 0x3f800000;
      chosenActions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      chosenActions._M_h._M_rehash_policy._4_4_ = 0;
      chosenActions._M_h._M_rehash_policy._M_next_resize = 0;
      iterationCounts._M_h._M_single_bucket =
           (__node_base_ptr)&inlinedUses._M_h._M_rehash_policy._M_next_resize;
      inlinedUses._M_h._M_buckets = (__buckets_ptr)0x1;
      inlinedUses._M_h._M_bucket_count = 0;
      inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      inlinedUses._M_h._M_element_count._0_4_ = 0x3f800000;
      inlinedUses._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      inlinedUses._M_h._M_rehash_policy._4_4_ = 0;
      inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var43 = (__node_base_ptr)name.super_IString.str._M_str;
      while (p_Var43 != (__node_base_ptr)0x0) {
        auStack_1d8 = (undefined1  [8])p_Var43->_M_nxt;
        name.super_IString.str._M_len = (size_t)p_Var43[1]._M_nxt;
        inlinedInto._M_h._M_single_bucket = p_Var43;
        local_98 = Module::getFunction(this->module,(IString)*(IString *)&p_Var43->_M_nxt);
        sVar44 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&iterationCounts._M_h._M_single_bucket,(key_type *)local_98);
        if (sVar44 == 0) {
          pmVar45 = std::
                    unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                    ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                  *)&state.inlinableFunctions._M_h._M_single_bucket,
                                 (key_type *)auStack_1d8);
          p_Var22 = (__node_ptr)
                    (pmVar45->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (p_Var66 = (__node_ptr)
                         (pmVar45->
                         super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                         )._M_impl.super__Vector_impl_data._M_start; p_Var66 != p_Var22;
              p_Var66 = (__node_ptr)
                        ((p_Var66->
                         super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                         ._M_storage._M_storage.__data + 0x10)) {
            chosenActions._M_h._M_single_bucket =
                 *(__node_base_ptr *)
                  &(p_Var66->
                   super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                   ._M_storage._M_storage.__align;
            sVar46 = std::
                     _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)local_228,(key_type *)&chosenActions._M_h._M_single_bucket);
            if (sVar46 == 0) {
              auStack_1a8 = (undefined1  [8])(chosenActions._M_h._M_single_bucket)->_M_nxt;
              inlinedName.super_IString.str._M_len =
                   (size_t)chosenActions._M_h._M_single_bucket[1]._M_nxt;
              inlinedUses._M_h._M_single_bucket =
                   (__node_base_ptr)
                   (local_98->super_Importable).super_Named.name.super_IString.str._M_len;
              scanner.
              super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
              .super_Pass._vptr_Pass =
                   (_func_int **)
                   (local_98->super_Importable).super_Named.name.super_IString.str._M_str;
              auStack_b8 = auStack_1a8;
              ___alloc_1 = (_Hash_node_base *)inlinedName.super_IString.str._M_len;
              pmVar37 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)&inlinedUses._M_h._M_single_bucket);
              IVar36 = pmVar37->size;
              pmVar37 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)auStack_b8);
              if ((double)(IVar36 + pmVar37->size) * 2.5 < 409600.0) {
                aVar23 = *(anon_struct_8_0_00000001_for___align *)
                          &(p_Var66->
                           super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                           ._M_storage._M_storage;
                pmVar37 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)aVar23);
                IVar4 = pmVar37->inliningMode;
                local_78 = aVar23;
                if (IVar4 != Full) {
                  pFVar18 = (this->functionSplitter)._M_t.
                            super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            .
                            super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                            ._M_head_impl;
                  if (pFVar18 == (FunctionSplitter *)0x0) {
                    __assert_fail("functionSplitter",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x5a3,
                                  "Function *wasm::(anonymous namespace)::Inlining::getActuallyInlinedFunction(Function *)"
                                 );
                  }
                  if (1 < IVar4 - SplitPatternA) {
                    __assert_fail("inliningMode == InliningMode::SplitPatternA || inliningMode == InliningMode::SplitPatternB"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x3c9,
                                  "Function *wasm::(anonymous namespace)::FunctionSplitter::getInlineableSplitFunction(Function *, InliningMode)"
                                 );
                  }
                  pFVar38 = *(FunctionSplitter **)((long)aVar23 + 8);
                  uVar62 = *(size_type *)((long)&(pFVar18->splits)._M_h + 8);
                  uVar63 = (ulong)pFVar38 % uVar62;
                  p_Var24 = (pFVar18->splits)._M_h._M_buckets[uVar63];
                  if (p_Var24 != (__node_base_ptr)0x0) {
                    _Var47._M_nxt = p_Var24->_M_nxt;
                    builder_00 = (FunctionSplitter *)_Var47._M_nxt[5]._M_nxt;
                    do {
                      if ((builder_00 == pFVar38) &&
                         (pFVar38 == (FunctionSplitter *)_Var47._M_nxt[2]._M_nxt))
                      goto LAB_00a3cb41;
                      _Var47._M_nxt = (_Var47._M_nxt)->_M_nxt;
                    } while ((_Var47._M_nxt != (_Hash_node_base *)0x0) &&
                            (builder_00 = (FunctionSplitter *)_Var47._M_nxt[5]._M_nxt,
                            (ulong)builder_00 % uVar62 == uVar63));
                  }
                  this_01 = &pFVar18->splits;
                  inlinedUses._M_h._M_single_bucket = (__node_base_ptr)this_01;
                  _Var47._M_nxt = (_Hash_node_base *)operator_new(0x30);
                  (_Var47._M_nxt)->_M_nxt = (_Hash_node_base *)0x0;
                  p_Var21 = *(_Hash_node_base **)((long)aVar23 + 8);
                  _Var47._M_nxt[1]._M_nxt = *(_Hash_node_base **)aVar23;
                  _Var47._M_nxt[2]._M_nxt = p_Var21;
                  _Var47._M_nxt[3]._M_nxt = (_Hash_node_base *)0x0;
                  _Var47._M_nxt[4]._M_nxt = (_Hash_node_base *)0x0;
                  builder.wasm = *(Module **)((long)&(pFVar18->splits)._M_h + 0x28);
                  scanner.
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                  .super_Pass._vptr_Pass = (_func_int **)_Var47._M_nxt;
                  auVar80 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                      ((ulong)((long)&(pFVar18->splits)._M_h + 0x20),
                                       *(size_type *)((long)&(pFVar18->splits)._M_h + 8),
                                       *(size_type *)((long)&(pFVar18->splits)._M_h + 0x18));
                  __n_00 = auVar80._8_8_;
                  if ((auVar80 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                    __s = (this_01->_M_h)._M_buckets;
                  }
                  else {
                    if (__n_00 == 1) {
                      __s = (__node_base_ptr *)((long)&(pFVar18->splits)._M_h + 0x30);
                      *(__node_base_ptr *)((long)&(pFVar18->splits)._M_h + 0x30) =
                           (__node_base_ptr)0x0;
                    }
                    else {
                      __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>
                            ::allocate((allocator_type *)auStack_b8,__n_00);
                      memset(__s,0,__n_00 * 8);
                    }
                    p_Var78 = (__node_base *)((long)&(pFVar18->splits)._M_h + 0x10);
                    _Var25._M_nxt = ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt;
                    ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt =
                         (_Hash_node_base *)0x0;
                    uVar62 = 0;
LAB_00a3ca52:
                    _Var70._M_nxt = _Var25._M_nxt;
                    uVar63 = uVar62;
                    if (_Var70._M_nxt != (_Hash_node_base *)0x0) {
                      _Var25._M_nxt = (_Var70._M_nxt)->_M_nxt;
                      uVar62 = (ulong)_Var70._M_nxt[5]._M_nxt % __n_00;
                      if (__s[uVar62] == (__node_base_ptr)0x0) goto LAB_00a3ca81;
                      (_Var70._M_nxt)->_M_nxt = __s[uVar62]->_M_nxt;
                      pp_Var48 = &__s[uVar62]->_M_nxt;
                      uVar62 = uVar63;
                      goto LAB_00a3ca98;
                    }
                    std::
                    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_deallocate_buckets(&this_01->_M_h);
                    *(size_type *)((long)&(pFVar18->splits)._M_h + 8) = __n_00;
                    (pFVar18->splits)._M_h._M_buckets = __s;
                    uVar63 = (ulong)pFVar38 % __n_00;
                  }
                  _Var47._M_nxt[5]._M_nxt = (_Hash_node_base *)pFVar38;
                  if (__s[uVar63] == (__node_base_ptr)0x0) {
                    p_Var21 = ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt;
                    (_Var47._M_nxt)->_M_nxt = p_Var21;
                    ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt = _Var47._M_nxt;
                    if (p_Var21 != (_Hash_node_base *)0x0) {
                      __s[(ulong)p_Var21[5]._M_nxt %
                          *(size_type *)((long)&(pFVar18->splits)._M_h + 8)] = _Var47._M_nxt;
                      __s = (pFVar18->splits)._M_h._M_buckets;
                    }
                    __s[uVar63] = (__node_base *)((long)&(pFVar18->splits)._M_h + 0x10);
                  }
                  else {
                    (_Var47._M_nxt)->_M_nxt = __s[uVar63]->_M_nxt;
                    __s[uVar63]->_M_nxt = _Var47._M_nxt;
                  }
                  psVar29 = (size_type *)((long)&(pFVar18->splits)._M_h + 0x18);
                  *psVar29 = *psVar29 + 1;
                  scanner.
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                  .super_Pass._vptr_Pass = (_func_int **)0x0;
                  builder_00 = pFVar18;
                  std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_Scoped_node::~_Scoped_node((_Scoped_node *)&inlinedUses._M_h._M_single_bucket);
LAB_00a3cb41:
                  local_78 = (anon_struct_8_0_00000001_for___align)_Var47._M_nxt[3]._M_nxt;
                  if ((anon_struct_8_0_00000001_for___align)_Var47._M_nxt[3]._M_nxt ==
                      (anon_struct_8_0_00000001_for___align)0x0) {
                    local_88 = (undefined1  [8])pFVar18->module;
                    if (IVar4 == SplitPatternB) {
                      pp_Var42 = &inlinedUses._M_h._M_single_bucket;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)pp_Var42,"inlineable-B",(allocator<char> *)auStack_b8);
                      local_78 = (anon_struct_8_0_00000001_for___align)
                                 FunctionSplitter::copyFunction
                                           (pFVar18,(Function *)aVar23,(string *)pp_Var42);
                      std::__cxx11::string::~string((string *)pp_Var42);
                      IVar36 = (pFVar18->options->inlining).partialInliningIfs;
                      func_2 = (Function *)CONCAT44(func_2._4_4_,IVar36);
                      if (IVar36 == 0) {
                        __assert_fail("MaxIfs > 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                      ,0x426,
                                      "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                                     );
                      }
                      builder.wasm = (Module *)((long)aVar23 + 0x38);
                      IVar36 = 0;
                      while( true ) {
                        if (((Index)func_2 == IVar36) ||
                           (pIVar40 = FunctionSplitter::getIf
                                                (*(Expression **)((long)local_78 + 0x60),IVar36),
                           pIVar40 == (If *)0x0)) break;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)auStack_b8,"outlined-B",(allocator<char> *)local_190);
                        pFVar49 = FunctionSplitter::copyFunction
                                            (pFVar18,(Function *)aVar23,(string *)auStack_b8);
                        std::__cxx11::string::~string((string *)auStack_b8);
                        pFVar49->body = pIVar40->ifTrue;
                        SVar79 = HeapType::getSignature((HeapType *)builder.wasm);
                        if ((SVar79.results.id.id == 0) || ((pFVar49->body->type).id == 0)) {
                          bVar34 = false;
                          results.id = 0;
                        }
                        else {
                          SVar79 = HeapType::getSignature((HeapType *)builder.wasm);
                          results = SVar79.results.id;
                          bVar34 = true;
                        }
                        Function::setResults(pFVar49,results);
                        sVar27 = (pFVar49->super_Importable).super_Named.name.super_IString.str;
                        FunctionSplitter::getForwardedArgs
                                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)local_190,(FunctionSplitter *)aVar23,(Function *)local_88,
                                   (Builder *)builder_00);
                        SVar79 = HeapType::getSignature(&pFVar49->type);
                        builder_00 = (FunctionSplitter *)local_190;
                        pCVar51 = Builder::makeCall((Builder *)local_88,(Name)sVar27,
                                                    (
                                                  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  *)local_190,SVar79.results.id,false);
                        pIVar40->ifTrue = (Expression *)pCVar51;
                        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                        ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       *)local_190);
                        if (bVar34) {
                          pEVar41 = pIVar40->ifTrue;
                          pRVar57 = MixedArena::alloc<wasm::Return>
                                              ((MixedArena *)((long)local_88 + 0x200));
                          pRVar57->value = pEVar41;
                          pIVar40->ifTrue = (Expression *)pRVar57;
                        }
                        IVar36 = IVar36 + 1;
                      }
                    }
                    else {
                      if (IVar4 != SplitPatternA) {
                        __assert_fail("inliningMode == InliningMode::SplitPatternB",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                      ,0x421,
                                      "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                                     );
                      }
                      pp_Var42 = &inlinedUses._M_h._M_single_bucket;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)pp_Var42,"inlineable-A",(allocator<char> *)auStack_b8);
                      local_78 = (anon_struct_8_0_00000001_for___align)
                                 FunctionSplitter::copyFunction
                                           (pFVar18,(Function *)aVar23,(string *)pp_Var42);
                      std::__cxx11::string::~string((string *)pp_Var42);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)auStack_b8,"outlined-A",(allocator<char> *)local_190);
                      pFVar49 = FunctionSplitter::copyFunction
                                          (pFVar18,(Function *)aVar23,(string *)auStack_b8);
                      std::__cxx11::string::~string((string *)auStack_b8);
                      pIVar40 = FunctionSplitter::getIf(*(Expression **)((long)local_78 + 0x60),0);
                      pUVar50 = Builder::makeUnary((Builder *)local_88,EqZInt32,pIVar40->condition);
                      pIVar40->condition = (Expression *)pUVar50;
                      sVar27 = (pFVar49->super_Importable).super_Named.name.super_IString.str;
                      FunctionSplitter::getForwardedArgs
                                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 local_190,(FunctionSplitter *)aVar23,(Function *)local_88,
                                 (Builder *)builder_00);
                      pCVar51 = Builder::makeCall((Builder *)local_88,(Name)sVar27,
                                                  (
                                                  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  *)local_190,(Type)0x0,false);
                      pIVar40->ifTrue = (Expression *)pCVar51;
                      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                      ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)local_190);
                      *(If **)((long)local_78 + 0x60) = pIVar40;
                      pBVar52 = Expression::cast<wasm::Block>(pFVar49->body);
                      it.index = 0;
                      it.parent = &pBVar52->list;
                      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                                (&(pBVar52->list).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,it);
                    }
                    _Var47._M_nxt[3]._M_nxt = (_Hash_node_base *)local_78;
                  }
                }
                (p_Var66->
                super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                ).
                super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                ._M_storage._M_storage.__align = local_78;
                IVar36 = this->inlinedNameHint;
                this->inlinedNameHint = IVar36 + 1;
                *(Index *)((long)&(p_Var66->
                                  super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                                  ._M_storage._M_storage + 0xc) = IVar36;
                pFVar49 = local_98;
                pmVar45 = std::
                          unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                          ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                        *)auStack_178,(key_type *)local_98);
                pIVar74 = (pmVar45->
                          super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                if (pIVar74 ==
                    (pmVar45->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  this_04 = (_Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                             *)std::
                               vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                               ::_M_check_len(pmVar45,(size_type)pFVar49,__s_00);
                  this_03 = (pmVar45->
                            super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  pIVar26 = (pmVar45->
                            super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                  pIVar53 = std::
                            _Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                            ::_M_allocate(this_04,(size_t)pFVar49);
                  *(undefined8 *)((long)pIVar53 + ((long)pIVar74 - (long)this_03) + 0x10) =
                       *(undefined8 *)
                        ((long)&(p_Var66->
                                super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                                ._M_storage._M_storage + 8);
                  aVar23 = (p_Var66->
                           super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                           ._M_storage._M_storage.__align;
                  puVar2 = (undefined8 *)((long)pIVar53 + ((long)pIVar74 - (long)this_03));
                  *puVar2 = (p_Var66->super__Hash_node_base)._M_nxt;
                  *(anon_struct_8_0_00000001_for___align *)(puVar2 + 1) = aVar23;
                  pIVar61 = pIVar53;
                  pIVar73 = pIVar53;
                  for (pIVar54 = this_03; pIVar73 = pIVar73 + 1, pIVar54 != pIVar74;
                      pIVar54 = pIVar54 + 1) {
                    *(pointer *)&pIVar61->insideATry = *(pointer *)&pIVar54->insideATry;
                    pFVar49 = pIVar54->contents;
                    pIVar61->callSite =
                         (Expression **)
                         (((_Vector_impl *)&pIVar54->callSite)->super__Vector_impl_data)._M_start;
                    pIVar61->contents = pFVar49;
                    pIVar61 = pIVar61 + 1;
                  }
                  for (; pIVar74 != pIVar26; pIVar74 = pIVar74 + 1) {
                    *(pointer *)&pIVar73->insideATry = *(pointer *)&pIVar74->insideATry;
                    pFVar49 = pIVar74->contents;
                    pIVar73->callSite =
                         (Expression **)
                         (((_Vector_impl *)&pIVar74->callSite)->super__Vector_impl_data)._M_start;
                    pIVar73->contents = pFVar49;
                    pIVar73 = pIVar73 + 1;
                  }
                  lVar55 = (long)(pmVar45->
                                 super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_03
                  ;
                  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x18;
                  std::
                  _Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                  ::_M_deallocate((_Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                                   *)this_03,(pointer)(lVar55 / 0x18),lVar55 % 0x18);
                  (pmVar45->
                  super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                  )._M_impl.super__Vector_impl_data._M_start = pIVar53;
                  (pmVar45->
                  super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                  )._M_impl.super__Vector_impl_data._M_finish = pIVar73;
                  (pmVar45->
                  super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar53 + (long)this_04;
                }
                else {
                  *(pointer *)&pIVar74->insideATry =
                       *(pointer *)
                        ((long)&(p_Var66->
                                super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                                ._M_storage._M_storage + 8);
                  aVar23 = (p_Var66->
                           super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                           ._M_storage._M_storage.__align;
                  (((_Vector_impl *)&pIVar74->callSite)->super__Vector_impl_data)._M_start =
                       (pointer)(p_Var66->super__Hash_node_base)._M_nxt;
                  pIVar74->contents = (Function *)aVar23;
                  ppIVar1 = &(pmVar45->
                             super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + 1;
                  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)p_Var66;
                }
                pmVar56 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&iterationCounts._M_h._M_single_bucket,
                                       (key_type *)auStack_1a8);
                *pmVar56 = *pmVar56 + 1;
                std::__detail::
                _Insert_base<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_228,&local_98);
                pmVar56 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&iterationCounts._M_h._M_single_bucket,
                                       (key_type *)auStack_1a8);
                uVar3 = *pmVar56;
                pmVar37 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)auStack_1a8);
                if ((pmVar37->refs).super___atomic_base<unsigned_int>._M_i < uVar3) {
                  __assert_fail("inlinedUses[inlinedName] <= infos[inlinedName].refs",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                ,0x555,
                                "void wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)"
                               );
                }
              }
            }
          }
        }
        p_Var43 = inlinedInto._M_h._M_single_bucket + 2;
      }
      if (chosenActions._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        PassUtils::FilteredPassRunner::FilteredPassRunner
                  ((FilteredPassRunner *)&inlinedUses._M_h._M_single_bucket,this->module,
                   (FuncSet *)local_228,&((this->super_Pass).runner)->options);
        scanner.
        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        .stack.fixed._M_elems[7].currp._0_1_ = 1;
        auStack_b8 = (undefined1  [8])operator_new(0x60);
        *(long *)((long)auStack_b8 + 8) = 0;
        *(long **)((long)auStack_b8 + 0x10) = (long *)((long)auStack_b8 + 0x20);
        *(long *)((long)auStack_b8 + 0x18) = 0;
        *(undefined1 *)((long)auStack_b8 + 0x20) = 0;
        *(undefined1 *)((long)auStack_b8 + 0x50) = 0;
        *(undefined ***)auStack_b8 = &PTR__Pass_011218c0;
        funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auStack_178;
        *(pointer *)((long)auStack_b8 + 0x58) =
             funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start;
        PassRunner::add((PassRunner *)&inlinedUses._M_h._M_single_bucket,
                        (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)auStack_b8);
        if (auStack_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)auStack_b8 + 8))();
        }
        auStack_b8 = (undefined1  [8])0x0;
        pp_Var42 = &inlinedUses._M_h._M_single_bucket;
        if (this->optimize == true) {
          OptUtils::addUsefulPassesAfterInlining((PassRunner *)pp_Var42);
        }
        PassRunner::run((PassRunner *)pp_Var42);
        PassRunner::~PassRunner((PassRunner *)pp_Var42);
        scanner.
        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
        .super_Pass._vptr_Pass = (_func_int **)&iterationCounts._M_h._M_single_bucket;
        scanner.
        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
        .super_Pass.name._M_dataplus._M_p =
             (pointer)std::
                      _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:1389:29)>
                      ::_M_invoke;
        scanner.
        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
        .super_Pass.runner =
             (PassRunner *)
             std::
             _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:1389:29)>
             ::_M_manager;
        inlinedUses._M_h._M_single_bucket = (__node_base_ptr)this;
        Module::removeFunctions(this->module,(function<bool_(wasm::Function_*)> *)pp_Var42);
        std::_Function_base::~_Function_base((_Function_base *)pp_Var42);
      }
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&iterationCounts._M_h._M_single_bucket);
      std::
      unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
      ::~unordered_map((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                        *)auStack_178);
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &name.super_IString.str._M_str);
    }
    InliningState::~InliningState((InliningState *)local_130);
    psVar67 = &inlinedInto._M_h._M_bucket_count;
    bVar34 = true;
    if (inlinedInto._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      while (psVar67 = (size_type *)*psVar67, psVar67 != (size_type *)0x0) {
        EHUtils::handleBlockNestedPops
                  ((EHUtils *)((__node_base *)(psVar67 + 1))->_M_nxt,(Function *)this->module,
                   (Module *)0x0,
                   (FeaturePolicy)
                   funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start);
      }
      psVar67 = &inlinedInto._M_h._M_bucket_count;
LAB_00a3d120:
      psVar67 = (size_type *)*psVar67;
      if (psVar67 != (size_type *)0x0) goto code_r0x00a3d128;
      pFVar18 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      if (pFVar18 == (FunctionSplitter *)0x0) goto LAB_00a3d28d;
      chosenActions._M_h._M_bucket_count = 0;
      auStack_178 = (undefined1  [8])0x0;
      chosenActions._M_h._M_buckets = (__buckets_ptr)0x0;
      inlinedUses._M_h._M_single_bucket =
           (__node_base_ptr)
           ((long)&scanner.
                   super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                   .super_Pass.name.field_2 + 8);
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)0x1;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.runner = (PassRunner *)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_string_length._0_4_ = 0x3f800000;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name.field_2._M_allocated_capacity = 0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name.field_2._8_8_ = 0;
      p_Var78 = (__node_base *)((long)&(pFVar18->splits)._M_h + 0x10);
      while (p_Var78 = p_Var78->_M_nxt, p_Var78 != (__node_base *)0x0) {
        if (*(value_type **)(p_Var78 + 3) != (value_type *)0x0) {
          std::__detail::
          _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&inlinedUses._M_h._M_single_bucket,*(value_type **)(p_Var78 + 3));
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_178,
                     (value_type *)(p_Var78 + 1));
        }
      }
      state.inlinableFunctions._M_h._M_buckets = (__buckets_ptr)0x0;
      pp_Var42 = &inlinedUses._M_h._M_single_bucket;
      state.inlinableFunctions._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)
           std::
           _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:995:29)>
           ::_M_invoke;
      state.inlinableFunctions._M_h._M_bucket_count =
           (size_type)
           std::
           _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:995:29)>
           ::_M_manager;
      local_130 = (undefined1  [8])pp_Var42;
      Module::removeFunctions(pFVar18->module,(function<bool_(wasm::Function_*)> *)local_130);
      std::_Function_base::~_Function_base((_Function_base *)local_130);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)pp_Var42);
      pp_Var31 = chosenActions._M_h._M_buckets;
      auVar32 = auStack_178;
      do {
        psVar58 = (size_t *)auVar32;
        if ((__buckets_ptr)psVar58 == pp_Var31) {
          bVar34 = false;
          goto LAB_00a3d27c;
        }
        inlinedUses._M_h._M_single_bucket = (__node_base_ptr)*psVar58;
        scanner.
        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
        .super_Pass._vptr_Pass = (_func_int **)psVar58[1];
        pmVar56 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_3d8,(key_type *)&inlinedUses._M_h._M_single_bucket);
        mVar5 = *pmVar56;
        *pmVar56 = mVar5 + 1;
        auVar32 = (undefined1  [8])(psVar58 + 2);
      } while (mVar5 + 1 < 5);
      bVar34 = true;
LAB_00a3d27c:
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_178);
      if ((__buckets_ptr)psVar58 != pp_Var31) goto LAB_00a3d290;
LAB_00a3d28d:
      bVar34 = false;
    }
    goto LAB_00a3d290;
  }
  goto LAB_00a3d2ac;
LAB_00a3c56e:
  (_Var60._M_nxt)->_M_nxt = (_Hash_node_base *)state.inlinableFunctions._M_h._M_bucket_count;
  state.inlinableFunctions._M_h._M_bucket_count = (size_type)_Var60._M_nxt;
  *(size_type **)((long)&pEVar41->_id + uVar62 * 8) = &state.inlinableFunctions._M_h._M_bucket_count
  ;
  if ((_Var60._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var42 = (__node_base_ptr *)((long)&pEVar41->_id + uVar63 * 8);
LAB_00a3c594:
    *pp_Var42 = _Var60._M_nxt;
  }
  goto LAB_00a3c53f;
LAB_00a3ca81:
  (_Var70._M_nxt)->_M_nxt = p_Var78->_M_nxt;
  p_Var78->_M_nxt = _Var70._M_nxt;
  __s[uVar62] = p_Var78;
  if ((_Var70._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var48 = __s + uVar63;
LAB_00a3ca98:
    *pp_Var48 = _Var70._M_nxt;
  }
  goto LAB_00a3ca52;
code_r0x00a3d128:
  pmVar56 = std::__detail::
            _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)local_3d8,(key_type *)((__node_base *)(psVar67 + 1))->_M_nxt);
  mVar5 = *pmVar56;
  *pmVar56 = mVar5 + 1;
  if (4 < mVar5 + 1) goto code_r0x00a3d13f;
  goto LAB_00a3d120;
code_r0x00a3d13f:
  bVar34 = true;
LAB_00a3d290:
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_228);
  uVar62 = (ulong)state.actionsForFunction._M_h._M_single_bucket._4_4_;
  if (bVar34) {
LAB_00a3d2ac:
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_3d8);
    return;
  }
  goto LAB_00a3bda5;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    // No point to do more iterations than the number of functions, as it means
    // we are infinitely recursing (which should be very rare in practice, but
    // it is possible that a recursive call can look like it is worth inlining).
    Index iterationNumber = 0;

    auto numOriginalFunctions = module->functions.size();

    // Track in how many iterations a function was inlined into. We are willing
    // to inline many times into a function within an iteration, as e.g. that
    // helps the case of many calls of a small getter. However, if we only do
    // more inlining in separate iterations then it is likely code that was the
    // result of previous inlinings that is now being inlined into. That is, an
    // old inlining added a call to somewhere, and now we are inlining into that
    // call. This is typically recursion, which to some extent can help, but
    // then like loop unrolling it loses its benefit quickly, so set a limit
    // here.
    //
    // In addition to inlining into a function, we track how many times we do
    // other potentially repetitive operations like splitting a function before
    // inlining, as any such repetitive operation should be limited in how many
    // times we perform it. (An exception is how many times we inlined a
    // function, which we do not want to limit - it can be profitable to inline
    // a call into a great many callsites, over many iterations.)
    //
    // (Track names here, and not Function pointers, as we can remove functions
    // while inlining, and it may be confusing during debugging to have a
    // pointer to something that was removed.)
    std::unordered_map<Name, Index> iterationCounts;

    const size_t MaxIterationsForFunc = 5;

    while (iterationNumber <= numOriginalFunctions) {
#ifdef INLINING_DEBUG
      std::cout << "inlining loop iter " << iterationNumber
                << " (numFunctions: " << module->functions.size() << ")\n";
#endif
      iterationNumber++;

      std::unordered_set<Function*> inlinedInto;

      prepare();
      iteration(inlinedInto);

      if (inlinedInto.empty()) {
        return;
      }

#ifdef INLINING_DEBUG
      std::cout << "  inlined into " << inlinedInto.size() << " funcs.\n";
#endif

      for (auto* func : inlinedInto) {
        EHUtils::handleBlockNestedPops(func, *module);
      }

      for (auto* func : inlinedInto) {
        if (++iterationCounts[func->name] >= MaxIterationsForFunc) {
          return;
        }
      }

      if (functionSplitter) {
        auto splitNames = functionSplitter->finish();
        for (auto name : splitNames) {
          if (++iterationCounts[name] >= MaxIterationsForFunc) {
            return;
          }
        }
      }
    }
  }